

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O0

bool __thiscall glslang::TConstUnionArray::operator==(TConstUnionArray *this,TConstUnionArray *rhs)

{
  TConstUnionArray *rhs_local;
  TConstUnionArray *this_local;
  
  if (this->unionArray == rhs->unionArray) {
    this_local._7_1_ = true;
  }
  else if ((this->unionArray == (TConstUnionVector *)0x0) ||
          (rhs->unionArray == (TConstUnionVector *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         std::operator==(&this->unionArray->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ,&rhs->unionArray->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        );
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const TConstUnionArray& rhs) const
    {
        // this includes the case that both are unallocated
        if (unionArray == rhs.unionArray)
            return true;

        if (! unionArray || ! rhs.unionArray)
            return false;

        return *unionArray == *rhs.unionArray;
    }